

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

_Bool monster_can_cast(monster_conflict *mon,_Bool innate)

{
  bitflag *flags;
  int iVar1;
  loc grid2;
  loc grid;
  loc grid2_00;
  ulong uVar2;
  _Bool _Var3;
  uint32_t uVar4;
  wchar_t wVar5;
  loc *gp;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  loc tgrid;
  wchar_t tdist;
  loc local_40;
  uint local_34;
  
  iVar1 = *(int *)(mon->race->flags + (ulong)!innate * 4 + -0xc);
  monster_get_target_dist_grid(mon,(int *)&local_34,&local_40);
  flags = mon->mflag;
  _Var3 = flag_has_dbg(flags,2,3,"mon->mflag","MFLAG_NICE");
  if ((iVar1 != 0 && !_Var3) && ((mon->target).midx != L'\0')) {
    iVar8 = iVar1 / 2;
    if (player->timed[0x30] == 0) {
      iVar8 = iVar1;
    }
    _Var3 = flag_has_dbg(flags,2,0xb,"mon->mflag","MFLAG_LESS_SPELL");
    if (_Var3) {
      iVar8 = iVar8 / 2;
      flag_off(flags,2,0xb);
    }
    bVar9 = local_34 == mon->best_range;
    uVar4 = Rand_div(100);
    if ((((int)uVar4 < iVar8 << bVar9) && ((int)local_34 <= (int)(uint)z_info->max_range)) &&
       (grid2.y = local_40.y, grid2.x = local_40.x,
       _Var3 = projectable((chunk *)cave,mon->grid,grid2,L'\x2000'), _Var3)) {
      if (((local_40.x != (player->grid).x) || (local_40.y != (player->grid).y)) &&
         ((_Var3 = square_isview(cave,mon->grid), !_Var3 &&
          (grid.y = local_40.y, grid.x = local_40.x, _Var3 = square_isview(cave,grid), !_Var3)))) {
        gp = (loc *)mem_alloc((ulong)z_info->max_range << 3);
        grid2_00.y = local_40.y;
        grid2_00.x = local_40.x;
        wVar5 = project_path((chunk *)cave,gp,(uint)z_info->max_range,mon->grid,grid2_00,L'\x2000');
        bVar9 = L'\0' < wVar5;
        if ((L'\0' < wVar5) && (_Var3 = square_isview(cave,*gp), !_Var3)) {
          uVar6 = (ulong)(uint)wVar5;
          uVar2 = 1;
          do {
            uVar7 = uVar2;
            if (uVar6 == uVar7) {
              bVar9 = uVar7 < uVar6;
              goto LAB_0016e8e1;
            }
            _Var3 = square_isview(cave,gp[uVar7]);
            uVar2 = uVar7 + 1;
          } while (!_Var3);
          bVar9 = uVar7 < uVar6;
        }
LAB_0016e8e1:
        mem_free(gp);
        if (!bVar9) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool monster_can_cast(struct monster *mon, bool innate)
{
	int chance = innate ? mon->race->freq_innate : mon->race->freq_spell;
	int tdist;
	struct loc tgrid;

	monster_get_target_dist_grid(mon, &tdist, &tgrid);

	/* Cannot cast spells when nice */
	if (mflag_has(mon->mflag, MFLAG_NICE)) return false;

	/* Not allowed to cast spells */
	if (!chance) return false;

	/* No target to cast at */
	if (mon->target.midx == 0) return false;

	/* Taunted monsters are likely just to attack */
	if (player->timed[TMD_TAUNT]) {
		chance /= 2;
	}

	/* Monsters who have had mana burnt will cast less for this turn */
	if (mflag_has(mon->mflag, MFLAG_LESS_SPELL)) {
		chance /= 2;
		mflag_off(mon->mflag, MFLAG_LESS_SPELL);
	}

	/* Monsters at their preferred range are more likely to cast */
	if (tdist == mon->best_range) {
		chance *= 2;
	}

	/* Only do spells occasionally */
	if (randint0(100) >= chance) return false;

	/* Check range */
	if (tdist > z_info->max_range) return false;

	/* Check path */
	if (!projectable(cave, mon->grid, tgrid, PROJECT_SHORT))
		return false;

	/* If the target isn't the player, only cast if the player can witness */
	if ((tgrid.x != player->grid.x || tgrid.y != player->grid.y) &&
		!square_isview(cave, mon->grid) &&
		!square_isview(cave, tgrid)) {
		struct loc *path = mem_alloc(z_info->max_range * sizeof(*path));
		int npath, ipath;

		npath = project_path(cave, path, z_info->max_range, mon->grid, tgrid,
			PROJECT_SHORT);
		ipath = 0;
		while (1) {
			if (ipath >= npath) {
				/* No point on path visible.  Don't cast. */
				mem_free(path);
				return false;
			}
			if (square_isview(cave, path[ipath])) {
				break;
			}
			++ipath;
		}
		mem_free(path);
	}

	return true;
}